

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O2

void duckdb::ArrayFixedCombine<double,duckdb::CrossProductOp,3ul>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  idx_t count;
  bool bVar1;
  BoundFunctionExpression *pBVar2;
  reference pvVar3;
  Vector *vector;
  Vector *vector_00;
  idx_t iVar4;
  InvalidInputException *pIVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  idx_t iVar6;
  double *res_data;
  idx_t idx;
  allocator local_199;
  string *local_198;
  Vector *local_190;
  Vector *local_188;
  data_ptr_t local_180;
  data_ptr_t local_178;
  TemplatedValidityMask<unsigned_long> *local_170;
  TemplatedValidityMask<unsigned_long> *local_168;
  string local_160;
  string local_140;
  string local_120 [32];
  string local_100;
  string local_e0 [32];
  UnifiedVectorFormat rhs_format;
  UnifiedVectorFormat lhs_format;
  
  pBVar2 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  count = args->count;
  pvVar3 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  vector = ArrayVector::GetEntry(pvVar3);
  pvVar3 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  vector_00 = ArrayVector::GetEntry(pvVar3);
  local_190 = result;
  local_188 = ArrayVector::GetEntry(result);
  FlatVector::VerifyFlatVector(vector);
  FlatVector::VerifyFlatVector(vector_00);
  UnifiedVectorFormat::UnifiedVectorFormat(&lhs_format);
  UnifiedVectorFormat::UnifiedVectorFormat(&rhs_format);
  pvVar3 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  Vector::ToUnifiedFormat(pvVar3,count,&lhs_format);
  pvVar3 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  Vector::ToUnifiedFormat(pvVar3,count,&rhs_format);
  local_198 = (string *)
              &(pBVar2->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name;
  local_168 = &(vector->validity).super_TemplatedValidityMask<unsigned_long>;
  local_170 = &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>;
  local_178 = vector->data;
  local_180 = vector_00->data;
  res_data = (double *)local_188->data;
  idx = 0;
  do {
    if (count == idx) {
      if (count == 1) {
        Vector::SetVectorType(local_190,CONSTANT_VECTOR);
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&rhs_format);
      UnifiedVectorFormat::~UnifiedVectorFormat(&lhs_format);
      return;
    }
    iVar4 = idx;
    if ((lhs_format.sel)->sel_vector != (sel_t *)0x0) {
      iVar4 = (idx_t)(lhs_format.sel)->sel_vector[idx];
    }
    iVar6 = idx;
    if ((rhs_format.sel)->sel_vector != (sel_t *)0x0) {
      iVar6 = (idx_t)(rhs_format.sel)->sel_vector[idx];
    }
    if (((lhs_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) ||
        ((lhs_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar4 >> 6]
          >> (iVar4 & 0x3f) & 1) != 0)) &&
       ((params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  rhs_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask,
        rhs_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0 ||
        (params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  rhs_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [iVar6 >> 6], ((ulong)params >> (iVar6 & 0x3f) & 1) != 0)))) {
      bVar1 = TemplatedValidityMask<unsigned_long>::CheckAllValid(local_168,iVar4 * 3 + 3,iVar4 * 3)
      ;
      if (!bVar1) {
        pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  (local_e0,"%s: left argument can not contain NULL values",&local_199);
        ::std::__cxx11::string::string((string *)&local_100,local_198);
        StringUtil::Format<std::__cxx11::string>
                  (&local_160,(StringUtil *)local_e0,&local_100,params);
        InvalidInputException::InvalidInputException(pIVar5,&local_160);
        __cxa_throw(pIVar5,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      bVar1 = TemplatedValidityMask<unsigned_long>::CheckAllValid(local_170,iVar6 * 3 + 3,iVar6 * 3)
      ;
      if (!bVar1) {
        pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  (local_120,"%s: right argument can not contain NULL values",&local_199);
        ::std::__cxx11::string::string((string *)&local_140,local_198);
        StringUtil::Format<std::__cxx11::string>
                  (&local_160,(StringUtil *)local_120,&local_140,params);
        InvalidInputException::InvalidInputException(pIVar5,&local_160);
        __cxa_throw(pIVar5,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      CrossProductOp::Operation<double>
                ((double *)(local_178 + iVar4 * 0x18),(double *)(local_180 + iVar6 * 0x18),res_data,
                 3);
    }
    else {
      FlatVector::SetNull(local_190,idx,true);
    }
    idx = idx + 1;
    res_data = res_data + 3;
  } while( true );
}

Assistant:

static void ArrayFixedCombine(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	const auto count = args.size();
	auto &lhs_child = ArrayVector::GetEntry(args.data[0]);
	auto &rhs_child = ArrayVector::GetEntry(args.data[1]);
	auto &res_child = ArrayVector::GetEntry(result);

	const auto &lhs_child_validity = FlatVector::Validity(lhs_child);
	const auto &rhs_child_validity = FlatVector::Validity(rhs_child);

	UnifiedVectorFormat lhs_format;
	UnifiedVectorFormat rhs_format;

	args.data[0].ToUnifiedFormat(count, lhs_format);
	args.data[1].ToUnifiedFormat(count, rhs_format);

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);
	auto res_data = FlatVector::GetData<TYPE>(res_child);

	for (idx_t i = 0; i < count; i++) {
		const auto lhs_idx = lhs_format.sel->get_index(i);
		const auto rhs_idx = rhs_format.sel->get_index(i);

		if (!lhs_format.validity.RowIsValid(lhs_idx) || !rhs_format.validity.RowIsValid(rhs_idx)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		const auto left_offset = lhs_idx * N;
		if (!lhs_child_validity.CheckAllValid(left_offset + N, left_offset)) {
			throw InvalidInputException(StringUtil::Format("%s: left argument can not contain NULL values", func_name));
		}

		const auto right_offset = rhs_idx * N;
		if (!rhs_child_validity.CheckAllValid(right_offset + N, right_offset)) {
			throw InvalidInputException(
			    StringUtil::Format("%s: right argument can not contain NULL values", func_name));
		}
		const auto result_offset = i * N;

		const auto lhs_data_ptr = lhs_data + left_offset;
		const auto rhs_data_ptr = rhs_data + right_offset;
		const auto res_data_ptr = res_data + result_offset;

		OP::Operation(lhs_data_ptr, rhs_data_ptr, res_data_ptr, N);
	}

	if (count == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}